

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::parser::check(parser *this,int argc,bool ok)

{
  ostream *poVar1;
  bool local_b9;
  string local_b0;
  string local_90;
  string local_70;
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38;
  byte local_15;
  int local_14;
  bool ok_local;
  parser *ppStack_10;
  int argc_local;
  parser *this_local;
  
  local_3a = 0;
  local_4d = 0;
  local_15 = ok;
  local_14 = argc;
  ppStack_10 = this;
  if ((argc != 1) || (local_b9 = true, ok)) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,"help",&local_39);
    local_4d = 1;
    local_b9 = exist(this,&local_38);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (local_b9 != false) {
    usage_abi_cxx11_(&local_70,this);
    std::operator<<((ostream *)&std::cerr,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    exit(0);
  }
  if ((local_15 & 1) != 0) {
    return;
  }
  error_abi_cxx11_(&local_90,this);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_90);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  usage_abi_cxx11_(&local_b0,this);
  std::operator<<(poVar1,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  exit(1);
}

Assistant:

void check(int argc, bool ok) {
                if ((argc == 1 && !ok) || exist("help")) {
                    std::cerr << usage();
                    exit(0);
                }

                if (!ok) {
                    std::cerr << error() << std::endl << usage();
                    exit(1);
                }
            }